

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_vorbis.c
# Opt level: O0

void convert_channels_short_interleaved
               (int buf_c,short *buffer,int data_c,float **data,int d_offset,int len)

{
  long in_RCX;
  int in_EDX;
  undefined2 *in_RSI;
  int in_EDI;
  int in_R8D;
  int in_R9D;
  bool bVar1;
  float fVar2;
  int v;
  float f;
  float_conv temp;
  int j;
  int limit;
  int i;
  int in_stack_00000058;
  int in_stack_0000005c;
  float **in_stack_00000060;
  int in_stack_0000006c;
  short *in_stack_00000070;
  int local_44;
  int local_40;
  int local_34;
  int local_2c;
  undefined2 *local_10;
  
  if (((in_EDI == in_EDX) || (2 < in_EDI)) || (6 < in_EDX)) {
    local_44 = in_EDX;
    if (in_EDI < in_EDX) {
      local_44 = in_EDI;
    }
    local_10 = in_RSI;
    for (local_34 = 0; local_34 < in_R9D; local_34 = local_34 + 1) {
      for (local_2c = 0; local_2c < local_44; local_2c = local_2c + 1) {
        fVar2 = *(float *)(*(long *)(in_RCX + (long)local_2c * 8) + (long)(in_R8D + local_34) * 4) +
                384.0;
        local_40 = (int)fVar2 + -0x43c00000;
        if ((0xffff < (int)fVar2 + 0xbc408000U) && (bVar1 = local_40 < 0, local_40 = 0x7fff, bVar1))
        {
          local_40 = -0x8000;
        }
        *local_10 = (short)local_40;
        local_10 = local_10 + 1;
      }
      for (; local_2c < in_EDI; local_2c = local_2c + 1) {
        *local_10 = 0;
        local_10 = local_10 + 1;
      }
    }
  }
  else {
    for (local_2c = 0; local_2c < in_EDI; local_2c = local_2c + 1) {
      compute_stereo_samples
                (in_stack_00000070,in_stack_0000006c,in_stack_00000060,in_stack_0000005c,
                 in_stack_00000058);
    }
  }
  return;
}

Assistant:

static void convert_channels_short_interleaved(int buf_c, short *buffer, int data_c, float **data, int d_offset, int len)
{
   int i;
   check_endianness();
   if (buf_c != data_c && buf_c <= 2 && data_c <= 6) {
      assert(buf_c == 2);
      for (i=0; i < buf_c; ++i)
         compute_stereo_samples(buffer, data_c, data, d_offset, len);
   } else {
      int limit = buf_c < data_c ? buf_c : data_c;
      int j;
      for (j=0; j < len; ++j) {
         for (i=0; i < limit; ++i) {
            FASTDEF(temp);
            float f = data[i][d_offset+j];
            int v = FAST_SCALED_FLOAT_TO_INT(temp, f,15);//data[i][d_offset+j],15);
            if ((unsigned int) (v + 32768) > 65535)
               v = v < 0 ? -32768 : 32767;
            *buffer++ = v;
         }
         for (   ; i < buf_c; ++i)
            *buffer++ = 0;
      }
   }
}